

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void update_player_compact_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  wchar_t stat;
  wchar_t row;
  int iVar1;
  bool bVar2;
  
  t = Term;
  Term_activate((term *)user);
  stat = L'\0';
  prt_field(player->race->name,L'\0',L'\0');
  prt_field(player->class->name,L'\x01',L'\0');
  prt_title(L'\x02',L'\0');
  prt_level(L'\x03',L'\0');
  prt_exp(L'\x04',L'\0');
  iVar1 = 5;
  prt_gold(L'\x05',L'\0');
  prt_equippy(L'\x06',L'\0');
  row = L'\a';
  while( true ) {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) break;
    prt_stat(stat,row,L'\0');
    stat = stat + L'\x01';
    row = row + L'\x01';
  }
  prt_ac(L'\r',L'\0');
  prt_hp(L'\x0e',L'\0');
  prt_sp(L'\x0f',L'\0');
  prt_health_aux(L'\x10',L'\0');
  Term_fresh();
  Term_activate(t);
  return;
}

Assistant:

static void update_player_compact_subwindow(game_event_type type,
											game_event_data *data, void *user)
{
	int row = 0;
	int col = 0;
	int i;

	term *old = Term;
	term *inv_term = user;

	/* Activate */
	Term_activate(inv_term);

	/* Race and Class */
	prt_field(player->race->name, row++, col);
	prt_field(player->class->name, row++, col);

	/* Title */
	prt_title(row++, col);

	/* Level/Experience */
	prt_level(row++, col);
	prt_exp(row++, col);

	/* Gold */
	prt_gold(row++, col);

	/* Equippy chars */
	prt_equippy(row++, col);

	/* All Stats */
	for (i = 0; i < STAT_MAX; i++) prt_stat(i, row++, col);

	/* Empty row */
	row++;

	/* Armor */
	prt_ac(row++, col);

	/* Hitpoints */
	prt_hp(row++, col);

	/* Spellpoints */
	prt_sp(row++, col);

	/* Monster health */
	prt_health(row, col);

	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}